

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O1

void __thiscall MutableS2ShapeIndex::Encode(MutableS2ShapeIndex *this,Encoder *encoder)

{
  pointer puVar1;
  pointer puVar2;
  atomic<const_S2ShapeIndexCell_*> this_00;
  Encoder *encoder_00;
  uchar *puVar3;
  Encoder *encoder_01;
  Span<const_S2CellId> v;
  const_iterator cVar4;
  vector<S2CellId,_std::allocator<S2CellId>_> cell_ids;
  StringVectorEncoder encoded_cells;
  vector<S2CellId,_std::allocator<S2CellId>_> local_d8;
  S2CellId local_b8;
  Iterator local_b0;
  Encoder *local_70;
  StringVectorEncoder local_68;
  
  Encoder::Ensure(encoder,10);
  puVar3 = (uchar *)Varint::Encode64((char *)encoder->buf_,
                                     (long)(this->options_).max_edges_per_cell_ << 2);
  encoder->buf_ = puVar3;
  local_d8.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_d8.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_finish = (S2CellId *)0x0;
  local_d8.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (S2CellId *)0x0;
  std::vector<S2CellId,_std::allocator<S2CellId>_>::reserve
            (&local_d8,
             (this->cell_map_).
             super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
             .
             super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
             .
             super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
             .tree_.size_);
  s2coding::StringVectorEncoder::StringVectorEncoder(&local_68);
  local_b0.super_IteratorBase.id_.id_ = 0xffffffffffffffff;
  local_b0.super_IteratorBase.cell_._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_b0.super_IteratorBase._vptr_IteratorBase = (_func_int **)&PTR__IteratorBase_002c10d0;
  local_b0.iter_.node =
       (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
        *)0x0;
  encoder_01 = (Encoder *)0xffffffff;
  local_b0.iter_.position = -1;
  local_b0.end_.node =
       (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
        *)0x0;
  local_b0.end_.position = -1;
  if ((this->index_status_)._M_i != FRESH) {
    ApplyUpdatesThreadSafe(this);
  }
  local_b0.index_ = this;
  cVar4 = gtl::internal_btree::
          btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
          ::end((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                 *)&this->cell_map_);
  local_b0.end_.node = cVar4.node;
  local_b0.end_.position = cVar4.position;
  local_b0.iter_.node =
       gtl::internal_btree::
       btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
       ::leftmost((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                   *)&(local_b0.index_)->cell_map_);
  local_b0.iter_.position = 0;
  local_70 = encoder;
  if ((local_b0.iter_.node == local_b0.end_.node) && (local_b0.end_.position == 0)) {
    local_b0.super_IteratorBase.id_.id_ = 0xffffffffffffffff;
    local_b0.super_IteratorBase.cell_._M_b._M_p = (__base_type)(__pointer_type)0x0;
  }
  else {
    if (((ulong)local_b0.iter_.node & 7) != 0) {
      __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                    ,0x1e1,
                    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2ShapeIndexCell *>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2ShapeIndexCell *>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
                   );
    }
    encoder_01 = *(Encoder **)(local_b0.iter_.node + 0x10);
    local_b0.super_IteratorBase.cell_._M_b._M_p = *(__base_type *)(local_b0.iter_.node + 0x18);
    local_b0.super_IteratorBase.id_.id_ = (uint64)encoder_01;
  }
  while (encoder_00 = local_70,
        (Encoder *)local_b0.super_IteratorBase.id_.id_ != (Encoder *)0xffffffffffffffff) {
    local_b8.id_ = local_b0.super_IteratorBase.id_.id_;
    if (local_d8.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_d8.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<S2CellId,_std::allocator<S2CellId>_>::_M_realloc_insert<S2CellId>
                (&local_d8,
                 (iterator)
                 local_d8.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_b8);
    }
    else {
      (local_d8.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
       super__Vector_impl_data._M_finish)->id_ = local_b0.super_IteratorBase.id_.id_;
      local_d8.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_d8.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    this_00._M_b._M_p = local_b0.super_IteratorBase.cell_._M_b._M_p;
    puVar1 = (this->shapes_).
             super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar2 = (this->shapes_).
             super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_b8.id_ = Encoder::length(&local_68.data_);
    if (local_68.offsets_.
        super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_68.offsets_.
        super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
      _M_realloc_insert<unsigned_long_long>
                (&local_68.offsets_,
                 (iterator)
                 local_68.offsets_.
                 super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl
                 .super__Vector_impl_data._M_finish,&local_b8.id_);
    }
    else {
      *local_68.offsets_.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
       ._M_impl.super__Vector_impl_data._M_finish = local_b8.id_;
      local_68.offsets_.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_68.offsets_.
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    S2ShapeIndexCell::Encode
              ((S2ShapeIndexCell *)this_00._M_b._M_p,
               (int)((ulong)((long)puVar1 - (long)puVar2) >> 3),&local_68.data_);
    Iterator::Next(&local_b0);
  }
  v.ptr_ = (pointer)((long)local_d8.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_d8.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3);
  v.len_ = (size_type)local_70;
  s2coding::EncodeS2CellIdVector
            ((s2coding *)
             local_d8.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
             super__Vector_impl_data._M_start,v,encoder_01);
  s2coding::StringVectorEncoder::Encode(&local_68,encoder_00);
  Encoder::~Encoder(&local_68.data_);
  if (local_68.offsets_.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.offsets_.
                    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((s2coding *)
      local_d8.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
      super__Vector_impl_data._M_start != (s2coding *)0x0) {
    operator_delete(local_d8.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MutableS2ShapeIndex::Encode(Encoder* encoder) const {
  // The version number is encoded in 2 bits, under the assumption that by the
  // time we need 5 versions the first version can be permanently retired.
  // This only saves 1 byte, but that's significant for very small indexes.
  encoder->Ensure(Varint::kMax64);
  uint64 max_edges = options_.max_edges_per_cell();
  encoder->put_varint64(max_edges << 2 | kCurrentEncodingVersionNumber);

  vector<S2CellId> cell_ids;
  cell_ids.reserve(cell_map_.size());
  s2coding::StringVectorEncoder encoded_cells;
  for (Iterator it(this, S2ShapeIndex::BEGIN); !it.done(); it.Next()) {
    cell_ids.push_back(it.id());
    it.cell().Encode(num_shape_ids(), encoded_cells.AddViaEncoder());
  }
  s2coding::EncodeS2CellIdVector(cell_ids, encoder);
  encoded_cells.Encode(encoder);
}